

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O1

void __thiscall
Assimp::STEP::
InternGenericConvertList<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>,_1UL,_0UL>::
operator()(InternGenericConvertList<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>,_1UL,_0UL>
           *this,ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>,_1UL,_0UL> *out,
          shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *inp_base,DB *db)

{
  pointer *ppLVar1;
  element_type *peVar2;
  iterator __position;
  pointer pLVar3;
  long lVar4;
  Logger *this_00;
  TypeError *this_01;
  long lVar5;
  ulong uVar6;
  InternGenericConvert<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>_> local_71;
  undefined1 local_70 [64];
  
  peVar2 = (inp_base->
           super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  if (peVar2 == (element_type *)0x0) {
    lVar4 = 0;
  }
  else {
    lVar4 = __dynamic_cast(peVar2,&EXPRESS::DataType::typeinfo,&EXPRESS::LIST::typeinfo,0);
  }
  if (lVar4 != 0) {
    if (*(long *)(lVar4 + 0x10) == *(long *)(lVar4 + 8)) {
      this_00 = DefaultLogger::get();
      Logger::warn(this_00,"too few aggregate elements");
    }
    std::
    vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>_>_>
    ::reserve(&out->
               super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>_>_>
              ,*(long *)(lVar4 + 0x10) - *(long *)(lVar4 + 8) >> 4);
    if (*(long *)(lVar4 + 0x10) != *(long *)(lVar4 + 8)) {
      lVar5 = 8;
      uVar6 = 0;
      do {
        local_70._0_8_ = (element_type *)0x0;
        __position._M_current =
             (out->
             super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>_>_>
             ).
             super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (out->
            super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>_>_>
            ).
            super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>,std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>>>
          ::_M_realloc_insert<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>>
                    ((vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>,std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>>>
                      *)out,__position,(Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound> *)local_70);
        }
        else {
          (__position._M_current)->obj = (LazyObject *)0x0;
          ppLVar1 = &(out->
                     super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>_>_>
                     ).
                     super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppLVar1 = *ppLVar1 + 1;
        }
        pLVar3 = (out->
                 super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>_>_>
                 ).
                 super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_70._0_8_ = *(undefined8 *)(*(long *)(lVar4 + 8) + -8 + lVar5);
        local_70._8_8_ = *(long *)(*(long *)(lVar4 + 8) + lVar5);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_)->_M_use_count + 1;
          }
        }
        InternGenericConvert<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>_>::operator()
                  (&local_71,pLVar3 + -1,
                   (shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)local_70,db);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
        }
        uVar6 = uVar6 + 1;
        lVar5 = lVar5 + 0x10;
      } while (uVar6 < (ulong)(*(long *)(lVar4 + 0x10) - *(long *)(lVar4 + 8) >> 4));
    }
    return;
  }
  this_01 = (TypeError *)__cxa_allocate_exception(0x10);
  local_70._0_8_ = local_70 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,"type error reading aggregate","");
  TypeError::TypeError(this_01,(string *)local_70,0xffffffffffffffff,0xffffffffffffffff);
  __cxa_throw(this_01,&TypeError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void operator()(ListOf<T, min_cnt, max_cnt>& out, const std::shared_ptr< const EXPRESS::DataType >& inp_base, const STEP::DB& db) {

            const EXPRESS::LIST* inp = dynamic_cast<const EXPRESS::LIST*>(inp_base.get());
            if (!inp) {
                throw TypeError("type error reading aggregate");
            }

            // XXX is this really how the EXPRESS notation ([?:3],[1:3]) is intended?
            if (max_cnt && inp->GetSize() > max_cnt) {
                ASSIMP_LOG_WARN("too many aggregate elements");
            }
            else if (inp->GetSize() < min_cnt) {
                ASSIMP_LOG_WARN("too few aggregate elements");
            }

            out.reserve(inp->GetSize());
            for(size_t i = 0; i < inp->GetSize(); ++i) {

                out.push_back( typename ListOf<T, min_cnt, max_cnt>::OutScalar() );
                try{
                    GenericConvert(out.back(),(*inp)[i], db);
                }
                catch(const TypeError& t) {
                    throw TypeError(t.what() +std::string(" of aggregate"));
                }
            }
        }